

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SingleFileIndexedStorage.hpp
# Opt level: O1

KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_> * __thiscall
supermap::
SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>,_unsigned_long,_void>
::get(KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_> *__return_storage_ptr__,
     SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>,_unsigned_long,_void>
     *this,unsigned_long index)

{
  element_type *peVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  istream *is;
  long *local_78;
  string local_70;
  path local_50;
  
  peVar1 = (this->storageFile_).
           super___shared_ptr<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar2 = (peVar1->manager_).
           super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (peVar1->manager_).
            super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128ul>,supermap::ByteArray<4096ul>>,unsigned_long,void>
  ::getStorageFilePath_abi_cxx11_
            (&local_70,
             (SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128ul>,supermap::ByteArray<4096ul>>,unsigned_long,void>
              *)this);
  std::filesystem::__cxx11::path::path(&local_50,&local_70,auto_format);
  (**peVar2->_vptr_FileManager)(&local_78,peVar2,&local_50,index * 0x1080);
  is = (istream *)(**(code **)*local_78)(local_78);
  io::
  DeserializeHelper<supermap::KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>,_void>::
  deserialize(__return_storage_ptr__,is);
  (**(code **)(*local_78 + 0x18))(local_78);
  std::filesystem::__cxx11::path::~path(&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] T get(IndexT index) const override {
        assert(index < getItemsCount());
        return getFileManager()->template getInputIterator<T, IndexT>(
            getStorageFilePath(),
            index * io::FixedDeserializedSizeRegister<T>::exactDeserializedSize
        ).next();
    }